

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontroller.cpp
# Opt level: O0

float __thiscall IGameController::EvaluateSpawnPos(IGameController *this,CSpawnEval *pEval,vec2 Pos)

{
  long lVar1;
  int iVar2;
  CGameContext *pCVar3;
  CPlayer *this_00;
  long in_RSI;
  IGameController *in_RDI;
  long in_FS_OFFSET;
  float d;
  float Scoremod;
  CCharacter *pC;
  float Score;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  float in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  float local_34;
  CCharacter *local_30;
  float local_24;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_24 = 0.0;
  pCVar3 = GameServer(in_RDI);
  local_30 = (CCharacter *)CGameWorld::FindFirst(&pCVar3->m_World,3);
  while (local_30 != (CCharacter *)0x0) {
    local_34 = 1.0;
    if (*(int *)(in_RSI + 0xc) != -1) {
      this_00 = CCharacter::GetPlayer(local_30);
      iVar2 = CPlayer::GetTeam(this_00);
      if (iVar2 == *(int *)(in_RSI + 0xc)) {
        local_34 = 0.5;
      }
    }
    CEntity::GetPos(&local_30->super_CEntity);
    in_stack_ffffffffffffffc0 =
         distance<float>((vector2_base<float> *)
                         CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         (vector2_base<float> *)
                         CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if ((in_stack_ffffffffffffffc0 != 0.0) || (NAN(in_stack_ffffffffffffffc0))) {
      in_stack_ffffffffffffffc0 = 1.0 / in_stack_ffffffffffffffc0;
    }
    else {
      in_stack_ffffffffffffffc0 = 1e+09;
    }
    local_24 = local_34 * in_stack_ffffffffffffffc0 + local_24;
    local_30 = (CCharacter *)CEntity::TypeNext(&local_30->super_CEntity);
    in_stack_ffffffffffffffc4 = local_34;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_24;
  }
  __stack_chk_fail();
}

Assistant:

float IGameController::EvaluateSpawnPos(CSpawnEval *pEval, vec2 Pos) const
{
	float Score = 0.0f;
	CCharacter *pC = static_cast<CCharacter *>(GameServer()->m_World.FindFirst(CGameWorld::ENTTYPE_CHARACTER));
	for(; pC; pC = (CCharacter *)pC->TypeNext())
	{
		// team mates are not as dangerous as enemies
		float Scoremod = 1.0f;
		if(pEval->m_FriendlyTeam != -1 && pC->GetPlayer()->GetTeam() == pEval->m_FriendlyTeam)
			Scoremod = 0.5f;

		float d = distance(Pos, pC->GetPos());
		Score += Scoremod * (d == 0 ? 1000000000.0f : 1.0f/d);
	}

	return Score;
}